

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainMakefile2(cmGlobalUnixMakefileGenerator3 *this)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer ppcVar1;
  bool bVar2;
  Encoding encoding;
  char *pcVar3;
  uint uVar4;
  allocator local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  string makefileName;
  cmGeneratedFileStream makefileStream;
  
  pcVar3 = cmake::GetHomeOutputDirectory
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)&makefileName,pcVar3,(allocator *)&makefileStream);
  std::__cxx11::string::append((char *)&makefileName);
  std::__cxx11::string::append((char *)&makefileName);
  encoding = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
               [5])(this);
  cmGeneratedFileStream::cmGeneratedFileStream
            (&makefileStream,makefileName._M_dataplus._M_p,false,encoding);
  if (((&makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    this_00 = (cmLocalUnixMakefileGenerator3 *)
              *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    cmLocalUnixMakefileGenerator3::WriteDisclaimer(this_00,(ostream *)&makefileStream);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_2d8,"all",&local_2d9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               &local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::string((string *)&local_2d8,"default_target",&local_2d9);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_00,(ostream *)&makefileStream,
               "Default target executed when no arguments are given to make.",&local_2d8,&depends,
               &no_commands,true,false);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&depends);
    bVar2 = std::operator!=(&this->EmptyRuleHackDepends,"");
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&this->EmptyRuleHackDepends);
    }
    std::__cxx11::string::string((string *)&local_2d8,"all",&local_2d9);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_00,(ostream *)&makefileStream,"The main recursive all target",&local_2d8,
               &depends,&no_commands,true,false);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::string((string *)&local_2d8,"preinstall",&local_2d9);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_00,(ostream *)&makefileStream,"The main recursive preinstall target",&local_2d8,
               &depends,&no_commands,true,false);
    std::__cxx11::string::~string((string *)&local_2d8);
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop(this_00,(ostream *)&makefileStream);
    uVar4 = 0;
    while( true ) {
      ppcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        LocalGenerators.
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
          (ulong)uVar4) break;
      WriteConvenienceRules2
                (this,(ostream *)&makefileStream,(cmLocalUnixMakefileGenerator3 *)ppcVar1[uVar4]);
      uVar4 = uVar4 + 1;
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom
              ((cmLocalUnixMakefileGenerator3 *)*ppcVar1,(ostream *)&makefileStream);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&makefileStream);
  std::__cxx11::string::~string((string *)&makefileName);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainMakefile2()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += cmake::GetCMakeFilesDirectory();
  makefileName += "/Makefile2";
  cmGeneratedFileStream makefileStream(makefileName.c_str(), false,
                                       this->GetMakefileEncoding());
  if (!makefileStream) {
    return;
  }

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3* lg =
    static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(makefileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  // Just depend on the all target to drive the build.
  std::vector<std::string> depends;
  std::vector<std::string> no_commands;
  depends.push_back("all");

  // Write the rule.
  lg->WriteMakeRule(makefileStream,
                    "Default target executed when no arguments are "
                    "given to make.",
                    "default_target", depends, no_commands, true);

  depends.clear();

  // The all and preinstall rules might never have any dependencies
  // added to them.
  if (this->EmptyRuleHackDepends != "") {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write and empty all:
  lg->WriteMakeRule(makefileStream, "The main recursive all target", "all",
                    depends, no_commands, true);

  // Write an empty preinstall:
  lg->WriteMakeRule(makefileStream, "The main recursive preinstall target",
                    "preinstall", depends, no_commands, true);

  // Write out the "special" stuff
  lg->WriteSpecialTargetsTop(makefileStream);

  // write the target convenience rules
  unsigned int i;
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    lg = static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[i]);
    this->WriteConvenienceRules2(makefileStream, lg);
  }

  lg = static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);
  lg->WriteSpecialTargetsBottom(makefileStream);
}